

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

essentials_t *
opengv::relative_pose::fivept_nister
          (essentials_t *__return_storage_ptr__,RelativeAdapterBase *adapter,
          vector<int,_std::allocator<int>_> *indices)

{
  Indices idx;
  Indices local_20;
  
  local_20._useIndices = true;
  local_20._numberCorrespondences =
       (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start >> 2;
  local_20._indices = indices;
  fivept_nister(__return_storage_ptr__,adapter,&local_20);
  return __return_storage_ptr__;
}

Assistant:

opengv::essentials_t
opengv::relative_pose::fivept_nister(
    const RelativeAdapterBase & adapter,
    const std::vector<int> & indices )
{
  Indices idx(indices);
  return fivept_nister(adapter,idx);
}